

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  TableEntryPtr TVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ViewType k;
  NodeAndBucket NVar7;
  LogMessageFatal aLStack_28 [16];
  
  uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar1 == (this->super_UntypedMapBase).num_buckets_) ||
     ((this->super_UntypedMapBase).table_[uVar1] != 0)) {
    k._M_str = (char *)node[1].super_NodeBase.next;
    k._M_len = (size_t)node[2].super_NodeBase.next;
    NVar7 = FindHelper(this,k,(TreeIterator *)0x0);
    if (NVar7.node == (NodeBase *)0x0) {
      TVar2 = (this->super_UntypedMapBase).table_[b];
      if (TVar2 == 0) {
        UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
        uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar1 < b) {
          b = uVar1;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
        return;
      }
      if ((TVar2 & 1) == 0) {
        bVar3 = UntypedMapBase::TableEntryIsTooLong(&this->super_UntypedMapBase,b);
        if (!bVar3) {
          UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
          return;
        }
      }
      UntypedMapBase::InsertUniqueInTree
                (&this->super_UntypedMapBase,b,NodeToVariantKey,&node->super_NodeBase);
      return;
    }
    pcVar6 = "FindHelper(node->key()).node == nullptr";
    uVar4 = 0x27;
    uVar5 = 0x3fc;
  }
  else {
    pcVar6 = 
    "index_of_first_non_null_ == num_buckets_ || !TableEntryIsEmpty(index_of_first_non_null_)";
    uVar4 = 0x58;
    uVar5 = 0x3f7;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
             ,uVar5,uVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                !TableEntryIsEmpty(index_of_first_non_null_));
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(node->key()).node == nullptr);
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, NodeToVariantKey, node);
    }
  }